

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocket_test.cpp
# Opt level: O1

pint p_test_case_psocket_general_udp_test(void)

{
  int iVar1;
  undefined4 uVar2;
  pboolean pVar3;
  long lVar4;
  long lVar5;
  PSocketAddress *pPVar6;
  long lVar7;
  PSocketAddress *pPVar8;
  pchar sock_buf [10];
  undefined1 local_32 [10];
  
  p_test_module_fail_counter = 0;
  p_libsys_init();
  lVar4 = p_socket_new(2,2,0x11,0);
  if (lVar4 == 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x2f7);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_get_family(lVar4);
  if (iVar1 != 2) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x2f8);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_get_fd(lVar4);
  if (iVar1 < 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x2f9);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_get_listen_backlog(lVar4);
  if (iVar1 != 5) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x2fa);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_get_timeout(lVar4);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x2fb);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar5 = p_socket_get_remote_address(lVar4,0);
  if (lVar5 != 0) {
    iVar1 = p_socket_address_is_any(lVar5);
    if (iVar1 != 1) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
             ,0x301);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    p_socket_address_free(lVar5);
  }
  iVar1 = p_socket_get_protocol(lVar4);
  if (iVar1 != 0x11) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x306);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_get_blocking(lVar4);
  if (iVar1 != 1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x307);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_get_type(lVar4);
  if (iVar1 != 2) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x308);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_get_keepalive(lVar4);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x309);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_is_closed(lVar4);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x30a);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  p_socket_set_listen_backlog(lVar4,0xc);
  p_socket_set_timeout(lVar4,0xfffffff6);
  iVar1 = p_socket_get_timeout(lVar4);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x30e);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  p_socket_set_timeout(lVar4,10);
  iVar1 = p_socket_get_listen_backlog(lVar4);
  if (iVar1 != 0xc) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x311);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_get_timeout(lVar4);
  if (iVar1 != 10) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x312);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  pPVar6 = (PSocketAddress *)p_socket_address_new("127.0.0.1",0x7d6f);
  if (pPVar6 == (PSocketAddress *)0x0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x315);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_bind(lVar4,pPVar6,1,0);
  if (iVar1 != 1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x317);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  uVar2 = p_socket_get_fd(lVar4);
  lVar5 = p_socket_new_from_fd(uVar2,0);
  if (lVar5 == 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x31b);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_get_family(lVar5);
  if (iVar1 != 2) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x31c);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_get_fd(lVar5);
  if (iVar1 < 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x31d);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_get_listen_backlog(lVar5);
  if (iVar1 != 5) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x31e);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_get_timeout(lVar5);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,799);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar7 = p_socket_get_remote_address(lVar5,0);
  if (lVar7 != 0) {
    iVar1 = p_socket_address_is_any(lVar7);
    if (iVar1 != 1) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
             ,0x324);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    p_socket_address_free(lVar7);
  }
  iVar1 = p_socket_get_protocol(lVar5);
  if (iVar1 != 0x11) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x329);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_get_blocking(lVar5);
  if (iVar1 != 1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x32a);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_get_type(lVar5);
  if (iVar1 != 2) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x32b);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_get_keepalive(lVar5);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x32c);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_is_closed(lVar5);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x32d);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  p_socket_set_keepalive(lVar5,0);
  iVar1 = p_socket_get_keepalive(lVar5);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x330);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  p_socket_set_keepalive(lVar5,1);
  p_socket_set_keepalive(lVar5,0);
  iVar1 = p_socket_get_keepalive(lVar5);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x334);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  pPVar8 = (PSocketAddress *)p_socket_get_local_address(lVar4,0);
  if (pPVar8 == (PSocketAddress *)0x0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x338);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  pVar3 = compare_socket_addresses(pPVar6,pPVar8);
  if (pVar3 == 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x33a);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  p_socket_address_free(pPVar6);
  p_socket_address_free(pPVar8);
  p_socket_set_timeout(lVar4,1000);
  pPVar6 = (PSocketAddress *)p_socket_address_new("127.0.0.1",0x7d73);
  if (pPVar6 == (PSocketAddress *)0x0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x342);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_connect(lVar4,pPVar6,0);
  if (iVar1 != 1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x343);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_io_condition_wait(lVar4,1,0);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x345);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_io_condition_wait(lVar4,2,0);
  if (iVar1 != 1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x346);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  pPVar8 = (PSocketAddress *)p_socket_get_remote_address(lVar4,0);
  if (pPVar8 == (PSocketAddress *)0x0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x350);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  pVar3 = compare_socket_addresses(pPVar8,pPVar6);
  if (pVar3 == 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x351);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_set_buffer_size(lVar4,1,0x12000,0);
  if (iVar1 != 1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x356);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_set_buffer_size(lVar4,0,0x12000,0);
  if (iVar1 != 1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x357);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_check_connect_result(lVar4,0);
  if (iVar1 != 1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x358);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_is_connected(lVar4);
  if (iVar1 != 1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x35b);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_close(lVar4,0);
  if (iVar1 != 1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x35c);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_bind(lVar4,pPVar8,1,0);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x360);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_connect(lVar4,pPVar6,0);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x361);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_listen(lVar4,0);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x362);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar7 = p_socket_accept(lVar4,0);
  if (lVar7 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x363);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar7 = p_socket_receive(lVar4,local_32,10,0);
  if (lVar7 != -1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x364);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar7 = p_socket_receive_from(lVar4,0,local_32,10,0);
  if (lVar7 != -1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x365);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar7 = p_socket_send(lVar4,local_32,10,0);
  if (lVar7 != -1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x366);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar7 = p_socket_send_to(lVar4,pPVar6,local_32,10,0);
  if (lVar7 != -1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x367);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_shutdown(lVar4,1,1,0);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x368);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar7 = p_socket_get_local_address(lVar4,0);
  if (lVar7 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x369);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_check_connect_result(lVar4,0);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x36a);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_get_fd(lVar4);
  if (iVar1 != -1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x36b);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_is_connected(lVar4);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x36c);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_is_closed(lVar4);
  if (iVar1 != 1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x36d);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  p_socket_set_keepalive(lVar4,1);
  iVar1 = p_socket_get_keepalive(lVar4);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x370);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_io_condition_wait(lVar4,1,0);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x372);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_io_condition_wait(lVar4,2,0);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x373);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_set_buffer_size(lVar4,1,0x12000,0);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x375);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar1 = p_socket_set_buffer_size(lVar4,0,0x12000,0);
  if (iVar1 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocket_test.cpp"
           ,0x376);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  p_socket_address_free(pPVar8);
  p_socket_address_free(pPVar6);
  p_socket_free(lVar4);
  p_socket_free(lVar5);
  p_libsys_shutdown();
  return -(uint)(p_test_module_fail_counter != 0);
}

Assistant:

P_TEST_CASE_BEGIN (psocket_general_udp_test)
{
	p_libsys_init ();

	/* Test UDP socket */
	PSocket *socket = p_socket_new (P_SOCKET_FAMILY_INET,
					P_SOCKET_TYPE_DATAGRAM,
					P_SOCKET_PROTOCOL_UDP,
					NULL);

	P_TEST_CHECK (socket != NULL);
	P_TEST_CHECK (p_socket_get_family (socket) == P_SOCKET_FAMILY_INET);
	P_TEST_CHECK (p_socket_get_fd (socket) >= 0);
	P_TEST_CHECK (p_socket_get_listen_backlog (socket) == 5);
	P_TEST_CHECK (p_socket_get_timeout (socket) == 0);

	/* On some operating systems (i.e. OpenVMS) remote address is not NULL */
	PSocketAddress *remote_addr = p_socket_get_remote_address (socket, NULL);

	if (remote_addr != NULL) {
		P_TEST_CHECK (p_socket_address_is_any (remote_addr) == TRUE);
		p_socket_address_free (remote_addr);
		remote_addr = NULL;
	}

	P_TEST_CHECK (p_socket_get_protocol (socket) == P_SOCKET_PROTOCOL_UDP);
	P_TEST_CHECK (p_socket_get_blocking (socket) == TRUE);
	P_TEST_CHECK (p_socket_get_type (socket) == P_SOCKET_TYPE_DATAGRAM);
	P_TEST_CHECK (p_socket_get_keepalive (socket) == FALSE);
	P_TEST_CHECK (p_socket_is_closed (socket) == FALSE);

	p_socket_set_listen_backlog (socket, 12);
	p_socket_set_timeout (socket, -10);
	P_TEST_CHECK (p_socket_get_timeout (socket) == 0);
	p_socket_set_timeout (socket, 10);

	P_TEST_CHECK (p_socket_get_listen_backlog (socket) == 12);
	P_TEST_CHECK (p_socket_get_timeout (socket) == 10);

	PSocketAddress *sock_addr = p_socket_address_new ("127.0.0.1", 32111);
	P_TEST_CHECK (sock_addr != NULL);

	P_TEST_CHECK (p_socket_bind (socket, sock_addr, TRUE, NULL) == TRUE);

	/* Test creating socket from descriptor */
	PSocket *fd_socket = p_socket_new_from_fd (p_socket_get_fd (socket), NULL);
	P_TEST_CHECK (fd_socket != NULL);
	P_TEST_CHECK (p_socket_get_family (fd_socket) == P_SOCKET_FAMILY_INET);
	P_TEST_CHECK (p_socket_get_fd (fd_socket) >= 0);
	P_TEST_CHECK (p_socket_get_listen_backlog (fd_socket) == 5);
	P_TEST_CHECK (p_socket_get_timeout (fd_socket) == 0);

	remote_addr = p_socket_get_remote_address (fd_socket, NULL);

	if (remote_addr != NULL) {
		P_TEST_CHECK (p_socket_address_is_any (remote_addr) == TRUE);
		p_socket_address_free (remote_addr);
		remote_addr = NULL;
	}

	P_TEST_CHECK (p_socket_get_protocol (fd_socket) == P_SOCKET_PROTOCOL_UDP);
	P_TEST_CHECK (p_socket_get_blocking (fd_socket) == TRUE);
	P_TEST_CHECK (p_socket_get_type (fd_socket) == P_SOCKET_TYPE_DATAGRAM);
	P_TEST_CHECK (p_socket_get_keepalive (fd_socket) == FALSE);
	P_TEST_CHECK (p_socket_is_closed (fd_socket) == FALSE);

	p_socket_set_keepalive (fd_socket, FALSE);
	P_TEST_CHECK (p_socket_get_keepalive (fd_socket) == FALSE);

	p_socket_set_keepalive (fd_socket, TRUE);
	p_socket_set_keepalive (fd_socket, FALSE);
	P_TEST_CHECK (p_socket_get_keepalive (fd_socket) == FALSE);

	/* Test UDP local address */
	PSocketAddress *addr = p_socket_get_local_address (socket, NULL);
	P_TEST_CHECK (addr != NULL);

	P_TEST_CHECK (compare_socket_addresses (sock_addr, addr) == TRUE);

	p_socket_address_free (sock_addr);
	p_socket_address_free (addr);

	/* Test UDP connecting to remote address */
	p_socket_set_timeout (socket, 1000);
	addr = p_socket_address_new ("127.0.0.1", 32115);
	P_TEST_CHECK (addr != NULL);
	P_TEST_CHECK (p_socket_connect (socket, addr, NULL) == TRUE);

	P_TEST_CHECK (p_socket_io_condition_wait (socket, P_SOCKET_IO_CONDITION_POLLIN, NULL) == FALSE);
	P_TEST_CHECK (p_socket_io_condition_wait (socket, P_SOCKET_IO_CONDITION_POLLOUT, NULL) == TRUE);

	sock_addr = p_socket_get_remote_address (socket, NULL);

	/* Syllable doesn't support getpeername() for UDP sockets */
#ifdef P_OS_SYLLABLE
	P_TEST_CHECK (sock_addr == NULL);
	sock_addr = p_socket_address_new ("127.0.0.1", 32115);
	P_TEST_CHECK (addr != NULL);
#else
	P_TEST_CHECK (sock_addr != NULL);
	P_TEST_CHECK (compare_socket_addresses (sock_addr, addr) == TRUE);
#endif

	/* Not supported on Syllable */
#ifndef P_OS_SYLLABLE
	P_TEST_CHECK (p_socket_set_buffer_size (socket, P_SOCKET_DIRECTION_RCV, 72 * 1024, NULL) == TRUE);
	P_TEST_CHECK (p_socket_set_buffer_size (socket, P_SOCKET_DIRECTION_SND, 72 * 1024, NULL) == TRUE);
	P_TEST_CHECK (p_socket_check_connect_result (socket, NULL) == TRUE);
#endif

	P_TEST_CHECK (p_socket_is_connected (socket) == TRUE);
	P_TEST_CHECK (p_socket_close (socket, NULL) == TRUE);

	pchar sock_buf[10];

	P_TEST_CHECK (p_socket_bind (socket, sock_addr, TRUE, NULL) == FALSE);
	P_TEST_CHECK (p_socket_connect (socket, addr, NULL) == FALSE);
	P_TEST_CHECK (p_socket_listen (socket, NULL) == FALSE);
	P_TEST_CHECK (p_socket_accept (socket, NULL) == FALSE);
	P_TEST_CHECK (p_socket_receive (socket, sock_buf, sizeof (sock_buf), NULL) == -1);
	P_TEST_CHECK (p_socket_receive_from (socket, NULL, sock_buf, sizeof (sock_buf), NULL) == -1);
	P_TEST_CHECK (p_socket_send (socket, sock_buf, sizeof (sock_buf), NULL) == -1);
	P_TEST_CHECK (p_socket_send_to (socket, addr, sock_buf, sizeof (sock_buf), NULL) == -1);
	P_TEST_CHECK (p_socket_shutdown (socket, TRUE, TRUE, NULL) == FALSE);
	P_TEST_CHECK (p_socket_get_local_address (socket, NULL) == NULL);
	P_TEST_CHECK (p_socket_check_connect_result (socket, NULL) == FALSE);
	P_TEST_CHECK (p_socket_get_fd (socket) == -1);
	P_TEST_CHECK (p_socket_is_connected (socket) == FALSE);
	P_TEST_CHECK (p_socket_is_closed (socket) == TRUE);

	p_socket_set_keepalive (socket, TRUE);
	P_TEST_CHECK (p_socket_get_keepalive (socket) == FALSE);

	P_TEST_CHECK (p_socket_io_condition_wait (socket, P_SOCKET_IO_CONDITION_POLLIN, NULL) == FALSE);
	P_TEST_CHECK (p_socket_io_condition_wait (socket, P_SOCKET_IO_CONDITION_POLLOUT, NULL) == FALSE);

	P_TEST_CHECK (p_socket_set_buffer_size (socket, P_SOCKET_DIRECTION_RCV, 72 * 1024, NULL) == FALSE);
	P_TEST_CHECK (p_socket_set_buffer_size (socket, P_SOCKET_DIRECTION_SND, 72 * 1024, NULL) == FALSE);

	p_socket_address_free (sock_addr);
	p_socket_address_free (addr);
	p_socket_free (socket);
	p_socket_free (fd_socket);

	p_libsys_shutdown ();
}